

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::anon_unknown_14::fulltext_log_assert_to_stream(ostream *s,AssertData *rb)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_68;
  char *local_58;
  char *local_40;
  AssertData *rb_local;
  ostream *s_local;
  
  if ((rb->m_at & (is_throws_with|is_throws_as)) == 0) {
    poVar1 = Color::operator<<(s,Cyan);
    pcVar2 = assertString(rb->m_at);
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"( ");
    poVar1 = std::operator<<(poVar1,rb->m_expr);
    poVar1 = std::operator<<(poVar1," ) ");
    Color::operator<<(poVar1,None);
  }
  if ((rb->m_at & is_throws) == 0) {
    if (((rb->m_at & is_throws_as) == 0) || ((rb->m_at & is_throws_with) == 0)) {
      if ((rb->m_at & is_throws_as) == 0) {
        if ((rb->m_at & is_throws_with) == 0) {
          if ((rb->m_at & is_nothrow) == 0) {
            if ((rb->m_threw & 1U) == 0) {
              local_68 = "is NOT correct!\n";
              if (((rb->m_failed ^ 0xffU) & 1) != 0) {
                local_68 = "is correct!\n";
              }
            }
            else {
              local_68 = "THREW exception: ";
            }
            std::operator<<(s,local_68);
            if ((rb->m_threw & 1U) == 0) {
              poVar1 = std::operator<<(s,"  values: ");
              pcVar2 = assertString(rb->m_at);
              poVar1 = std::operator<<(poVar1,pcVar2);
              poVar1 = std::operator<<(poVar1,"( ");
              poVar1 = doctest::operator<<(poVar1,&rb->m_decomp);
              std::operator<<(poVar1," )\n");
            }
            else {
              poVar1 = doctest::operator<<(s,&rb->m_exception);
              std::operator<<(poVar1,"\n");
            }
          }
          else {
            pcVar2 = "didn\'t throw!";
            if ((rb->m_threw & 1U) != 0) {
              pcVar2 = "THREW exception: ";
            }
            poVar1 = std::operator<<(s,pcVar2);
            poVar1 = Color::operator<<(poVar1,Cyan);
            poVar1 = doctest::operator<<(poVar1,&rb->m_exception);
            std::operator<<(poVar1,"\n");
          }
        }
        else {
          poVar1 = Color::operator<<(s,Cyan);
          pcVar2 = assertString(rb->m_at);
          poVar1 = std::operator<<(poVar1,pcVar2);
          poVar1 = std::operator<<(poVar1,"( ");
          poVar1 = std::operator<<(poVar1,rb->m_expr);
          poVar1 = std::operator<<(poVar1,", \"");
          poVar1 = std::operator<<(poVar1,rb->m_exception_string);
          poVar1 = std::operator<<(poVar1,"\" ) ");
          poVar1 = Color::operator<<(poVar1,None);
          if ((rb->m_threw & 1U) == 0) {
            local_58 = "did NOT throw at all!";
          }
          else {
            local_58 = "threw a DIFFERENT exception: ";
            if (((rb->m_failed ^ 0xffU) & 1) != 0) {
              local_58 = "threw as expected!";
            }
          }
          poVar1 = std::operator<<(poVar1,local_58);
          poVar1 = Color::operator<<(poVar1,Cyan);
          poVar1 = doctest::operator<<(poVar1,&rb->m_exception);
          std::operator<<(poVar1,"\n");
        }
      }
      else {
        poVar1 = Color::operator<<(s,Cyan);
        pcVar2 = assertString(rb->m_at);
        poVar1 = std::operator<<(poVar1,pcVar2);
        poVar1 = std::operator<<(poVar1,"( ");
        poVar1 = std::operator<<(poVar1,rb->m_expr);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = std::operator<<(poVar1,rb->m_exception_type);
        poVar1 = std::operator<<(poVar1," ) ");
        poVar1 = Color::operator<<(poVar1,None);
        if ((rb->m_threw & 1U) == 0) {
          local_40 = "did NOT throw at all!";
        }
        else {
          local_40 = "threw a DIFFERENT exception: ";
          if ((rb->m_threw_as & 1U) != 0) {
            local_40 = "threw as expected!";
          }
        }
        poVar1 = std::operator<<(poVar1,local_40);
        poVar1 = Color::operator<<(poVar1,Cyan);
        poVar1 = doctest::operator<<(poVar1,&rb->m_exception);
        std::operator<<(poVar1,"\n");
      }
    }
    else {
      poVar1 = Color::operator<<(s,Cyan);
      pcVar2 = assertString(rb->m_at);
      poVar1 = std::operator<<(poVar1,pcVar2);
      poVar1 = std::operator<<(poVar1,"( ");
      poVar1 = std::operator<<(poVar1,rb->m_expr);
      poVar1 = std::operator<<(poVar1,", \"");
      poVar1 = std::operator<<(poVar1,rb->m_exception_string);
      poVar1 = std::operator<<(poVar1,"\", ");
      poVar1 = std::operator<<(poVar1,rb->m_exception_type);
      poVar1 = std::operator<<(poVar1," ) ");
      Color::operator<<(poVar1,None);
      if ((rb->m_threw & 1U) == 0) {
        std::operator<<(s,"did NOT throw at all!\n");
      }
      else if ((rb->m_failed & 1U) == 0) {
        std::operator<<(s,"threw as expected!\n");
      }
      else {
        poVar1 = std::operator<<(s,"threw a DIFFERENT exception! (contents: ");
        poVar1 = doctest::operator<<(poVar1,&rb->m_exception);
        std::operator<<(poVar1,")\n");
      }
    }
  }
  else {
    pcVar2 = "did NOT throw at all!";
    if ((rb->m_threw & 1U) != 0) {
      pcVar2 = "threw as expected!";
    }
    poVar1 = std::operator<<(s,pcVar2);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void fulltext_log_assert_to_stream(std::ostream& s, const AssertData& rb) {
        if((rb.m_at & (assertType::is_throws_as | assertType::is_throws_with)) ==
            0) //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << " ) "
                << Color::None;

        if(rb.m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            s << (rb.m_threw ? "threw as expected!" : "did NOT throw at all!") << "\n";
        } else if((rb.m_at & assertType::is_throws_as) &&
                    (rb.m_at & assertType::is_throws_with)) { //!OCLINT
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", \""
                << rb.m_exception_string << "\", " << rb.m_exception_type << " ) " << Color::None;
            if(rb.m_threw) {
                if(!rb.m_failed) {
                    s << "threw as expected!\n";
                } else {
                    s << "threw a DIFFERENT exception! (contents: " << rb.m_exception << ")\n";
                }
            } else {
                s << "did NOT throw at all!\n";
            }
        } else if(rb.m_at &
                    assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", "
                << rb.m_exception_type << " ) " << Color::None
                << (rb.m_threw ? (rb.m_threw_as ? "threw as expected!" :
                                                "threw a DIFFERENT exception: ") :
                                "did NOT throw at all!")
                << Color::Cyan << rb.m_exception << "\n";
        } else if(rb.m_at &
                    assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            s << Color::Cyan << assertString(rb.m_at) << "( " << rb.m_expr << ", \""
                << rb.m_exception_string << "\" ) " << Color::None
                << (rb.m_threw ? (!rb.m_failed ? "threw as expected!" :
                                                "threw a DIFFERENT exception: ") :
                                "did NOT throw at all!")
                << Color::Cyan << rb.m_exception << "\n";
        } else if(rb.m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            s << (rb.m_threw ? "THREW exception: " : "didn't throw!") << Color::Cyan
                << rb.m_exception << "\n";
        } else {
            s << (rb.m_threw ? "THREW exception: " :
                                (!rb.m_failed ? "is correct!\n" : "is NOT correct!\n"));
            if(rb.m_threw)
                s << rb.m_exception << "\n";
            else
                s << "  values: " << assertString(rb.m_at) << "( " << rb.m_decomp << " )\n";
        }
    }